

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

size_t pugi::impl::anon_unknown_0::strlength_wide(wchar_t *s)

{
  long lVar1;
  long lVar2;
  wchar_t *end;
  
  lVar2 = -4;
  do {
    lVar1 = lVar2 + 4;
    lVar2 = lVar2 + 4;
  } while (*(int *)((long)s + lVar1) != 0);
  return lVar2 >> 2;
}

Assistant:

PUGI__FN size_t strlength_wide(const wchar_t* s)
	{
		assert(s);

	#ifdef PUGIXML_WCHAR_MODE
		return wcslen(s);
	#else
		const wchar_t* end = s;
		while (*end) end++;
		return static_cast<size_t>(end - s);
	#endif
	}